

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err http_entity_alloc_data(nni_http_entity *entity,size_t size)

{
  void *local_28;
  void *newdata;
  size_t size_local;
  nni_http_entity *entity_local;
  
  if ((size == 0) || (local_28 = nni_zalloc(size), local_28 != (void *)0x0)) {
    http_entity_set_data(entity,local_28,size);
    entity->own = true;
    entity_local._4_4_ = NNG_OK;
  }
  else {
    entity_local._4_4_ = NNG_ENOMEM;
  }
  return entity_local._4_4_;
}

Assistant:

static nng_err
http_entity_alloc_data(nni_http_entity *entity, size_t size)
{
	void *newdata;
	if (size != 0) {
		if ((newdata = nni_zalloc(size)) == NULL) {
			return (NNG_ENOMEM);
		}
	}
	http_entity_set_data(entity, newdata, size);
	entity->own = true;
	return (NNG_OK);
}